

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  pp_Var1 = (_func_int **)vtt[2];
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcRepresentationContext).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcRepresentationContext).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[4];
  *(undefined1 **)
   &(this->super_IfcRepresentationContext).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x10 =
       &(this->super_IfcRepresentationContext).
        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x20;
  *(undefined8 *)
   &(this->super_IfcRepresentationContext).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x18 = 0;
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.field_0x20 = 0;
  (this->super_IfcRepresentationContext).field_0x30 = 0;
  (this->super_IfcRepresentationContext).ContextType.ptr._M_dataplus._M_p =
       (pointer)&(this->super_IfcRepresentationContext).ContextType.ptr.field_2;
  (this->super_IfcRepresentationContext).ContextType.ptr._M_string_length = 0;
  (this->super_IfcRepresentationContext).ContextType.ptr.field_2._M_local_buf[0] = '\0';
  (this->super_IfcRepresentationContext).ContextType.have = false;
  pvVar2 = vtt[5];
  *(void **)&(this->super_IfcRepresentationContext).field_0x60 = pvVar2;
  *(void **)(&(this->super_IfcRepresentationContext).field_0x60 + *(long *)((long)pvVar2 + -0x18)) =
       vtt[6];
  *(undefined8 *)&(this->super_IfcRepresentationContext).field_0x68 = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcRepresentationContext).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[7];
  *(void **)&(this->super_IfcRepresentationContext).field_0x60 = vtt[8];
  (this->Precision).have = false;
  (this->WorldCoordinateSystem).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->WorldCoordinateSystem).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->WorldCoordinateSystem).
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  *(undefined8 *)((long)&(this->TrueNorth).ptr.obj + 1) = 0;
  return;
}

Assistant:

ObjectHelper()
        : aux_is_derived(0) {
            // empty
        }